

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O1

void Am_Move_Cursor_To(Am_Object *text,int n)

{
  int iVar1;
  Am_Value *in_value;
  char *pcVar2;
  int iVar3;
  Am_String p;
  Am_Object AStack_28;
  Am_String local_20;
  
  in_value = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&local_20,in_value);
  pcVar2 = Am_String::operator_cast_to_char_(&local_20);
  iVar1 = ml_strlen(pcVar2);
  pcVar2 = Am_String::operator_cast_to_char_(&local_20);
  iVar3 = 0;
  if ((*pcVar2 == '\x1b') && (pcVar2[1] == '$')) {
    iVar3 = ((pcVar2[2] & 0xf8U) == 0x28) + 3;
  }
  if ((n <= iVar1) && (iVar3 <= n)) {
    Am_Object::Set(text,0xad,n,0);
  }
  Am_Object::Am_Object(&AStack_28,text);
  Am_Object::Set(&AStack_28,0xe4,false,0);
  Am_Object::Set(&AStack_28,0xaf,false,0);
  Am_Object::~Am_Object(&AStack_28);
  Am_String::~Am_String(&local_20);
  return;
}

Assistant:

void
Am_Move_Cursor_To(Am_Object text, int n)
{
  Am_String p = text.Get(Am_TEXT);
  int str_len = ml_strlen((const char *)p);
  int head_pos = ml_head_pos_str((const char *)p);

  if (n >= head_pos && n <= str_len)
    text.Set(Am_CURSOR_INDEX, n);
  Am_Set_Pending_Delete(text, false);
}